

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upgrade_memory_model.cpp
# Opt level: O0

Status __thiscall spvtools::opt::UpgradeMemoryModel::Process(UpgradeMemoryModel *this)

{
  bool bVar1;
  uint32_t uVar2;
  IRContext *this_00;
  FeatureManager *this_01;
  Module *this_02;
  Instruction *this_03;
  Instruction *memory_model;
  UpgradeMemoryModel *this_local;
  
  this_00 = Pass::context(&this->super_Pass);
  this_01 = IRContext::get_feature_mgr(this_00);
  bVar1 = FeatureManager::HasCapability(this_01,CapabilityCooperativeMatrixNV);
  if (!bVar1) {
    this_02 = Pass::get_module(&this->super_Pass);
    this_03 = Module::GetMemoryModel(this_02);
    uVar2 = opt::Instruction::GetSingleWordInOperand(this_03,0);
    if ((uVar2 == 0) && (uVar2 = opt::Instruction::GetSingleWordInOperand(this_03,1), uVar2 == 1)) {
      UpgradeMemoryModelInstruction(this);
      UpgradeInstructions(this);
      CleanupDecorations(this);
      UpgradeBarriers(this);
      UpgradeMemoryScope(this);
      return SuccessWithChange;
    }
  }
  return SuccessWithoutChange;
}

Assistant:

Pass::Status UpgradeMemoryModel::Process() {
  // TODO: This pass needs changes to support cooperative matrices.
  if (context()->get_feature_mgr()->HasCapability(
          spv::Capability::CooperativeMatrixNV)) {
    return Pass::Status::SuccessWithoutChange;
  }

  // Only update Logical GLSL450 to Logical VulkanKHR.
  Instruction* memory_model = get_module()->GetMemoryModel();
  if (memory_model->GetSingleWordInOperand(0u) !=
          uint32_t(spv::AddressingModel::Logical) ||
      memory_model->GetSingleWordInOperand(1u) !=
          uint32_t(spv::MemoryModel::GLSL450)) {
    return Pass::Status::SuccessWithoutChange;
  }

  UpgradeMemoryModelInstruction();
  UpgradeInstructions();
  CleanupDecorations();
  UpgradeBarriers();
  UpgradeMemoryScope();

  return Pass::Status::SuccessWithChange;
}